

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void LiteScript::StateExecutor::I_OP_POST_DECR(State *state,Instruction *instr)

{
  size_type sVar1;
  reference v;
  undefined1 local_48 [8];
  Variable result;
  undefined1 local_28 [8];
  Variable v1;
  Instruction *instr_local;
  State *state_local;
  
  state->line_num = state->line_num + 1;
  v1.nb_ref = (uint *)instr;
  sVar1 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    (&state->op_lifo);
  if (sVar1 != 0) {
    v = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                  (&state->op_lifo);
    Variable::Variable((Variable *)local_28,v);
    PopValue(state);
    Variable::operator--((Variable *)local_48,(int)local_28);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
              (&state->op_lifo,(value_type *)local_48);
    Variable::~Variable((Variable *)local_48);
    Variable::~Variable((Variable *)local_28);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_OP_POST_DECR(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() < 1)
        return;
    Variable v1(state.op_lifo.back());
    PopValue(state);
    Variable result = v1--;
    state.op_lifo.push_back(result);
}